

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O2

void __thiscall SqModules::registerIoLib(SqModules *this)

{
  Object *pOVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"iostream",&local_31);
  pOVar1 = findNativeModule(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (pOVar1 == (Object *)0x0) {
    registerIoStreamLib(this);
  }
  registerStdLibNativeModule(this,"io",sqstd_register_iolib);
  return;
}

Assistant:

void SqModules::registerIoLib()
{
  if (!findNativeModule("iostream"))
  {
    // register 'iostream' module containing basestream class and blob
    registerIoStreamLib();
  }

  registerStdLibNativeModule("io", sqstd_register_iolib);
}